

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O0

void __thiscall TcpConnection::do_read(TcpConnection *this)

{
  bool bVar1;
  log_level lVar2;
  Logger *pLVar3;
  enable_shared_from_this<TcpConnection> local_28;
  int local_14;
  TcpConnection *pTStack_10;
  int ret;
  TcpConnection *this_local;
  
  pTStack_10 = this;
  local_14 = InputBuffer::read_from_fd(&this->tc_ibuf,this->tc_fd);
  if (local_14 == -1) {
    if (-1 < pr_level) {
      printf("[%-5s][%s:%d] read data from socket error\n","error","do_read",0x2e);
    }
    do_close(this);
  }
  else if (local_14 == 0) {
    pLVar3 = Logger::get_instance();
    bVar1 = Logger::is_inited(pLVar3);
    if ((!bVar1) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","do_read",0x33);
    }
    lVar2 = Logger::get_log_level();
    if (1 < (int)lVar2) {
      pLVar3 = Logger::get_instance();
      Logger::write_log(pLVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                        ,"do_read",0x33,LOG_LEVEL_INFO,"connection closed by peer\n");
      pLVar3 = Logger::get_instance();
      Logger::flush(pLVar3);
    }
    do_close(this);
  }
  else {
    std::enable_shared_from_this<TcpConnection>::shared_from_this(&local_28);
    std::function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)>::operator()
              (&this->tc_message_cb,(shared_ptr<TcpConnection> *)&local_28,&this->tc_ibuf);
    std::shared_ptr<TcpConnection>::~shared_ptr((shared_ptr<TcpConnection> *)&local_28);
  }
  return;
}

Assistant:

void TcpConnection::do_read() {
    if (int ret = tc_ibuf.read_from_fd(tc_fd); ret == -1) {
        PR_ERROR("read data from socket error\n");
        this->do_close();
        return;
    }
    else if (ret == 0) {
        LOG_INFO("connection closed by peer\n");
        this->do_close();
        return;
    }

    tc_message_cb(shared_from_this(), &tc_ibuf);

    return;
}